

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalFileLog.cpp
# Opt level: O2

void ApprovalFileLog::initialize(void)

{
  allocator local_49;
  string local_48;
  string local_28;
  
  if (initialize()::isInitialized == '\0') {
    initialize()::isInitialized = '\x01';
    getLogFilePath_abi_cxx11_();
    std::__cxx11::string::string((string *)&local_48,"",&local_49);
    ApprovalTests::FileUtils::writeToFile(&local_28,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_28);
  }
  return;
}

Assistant:

void ApprovalFileLog::initialize()
{
    static bool isInitialized{false};
    if (isInitialized)
    {
        return;
    }
    isInitialized = true;
    ApprovalTests::FileUtils::writeToFile(getLogFilePath(), "");
}